

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

Layer * setupLayer(Layer *l,mapfunc_t *map,int mc,int8_t zoom,int8_t edge,uint64_t saltbase,Layer *p
                  ,Layer *p2)

{
  uint64_t uVar1;
  int8_t in_CL;
  int8_t in_DL;
  mapfunc_t *in_RSI;
  Layer *in_RDI;
  int8_t in_R8B;
  uint64_t in_R9;
  undefined2 in_stack_00000010;
  
  in_RDI->getMap = in_RSI;
  in_RDI->mc = in_DL;
  in_RDI->zoom = in_CL;
  in_RDI->edge = in_R8B;
  in_RDI->scale = 0;
  if ((in_R9 == 0) || (in_R9 == 0xffffffffffffffff)) {
    in_RDI->layerSalt = in_R9;
  }
  else {
    uVar1 = getLayerSalt(in_R9);
    in_RDI->layerSalt = uVar1;
  }
  in_RDI->startSalt = 0;
  in_RDI->startSeed = 0;
  in_RDI->noise = (void *)0x0;
  in_RDI->data = (void *)0x0;
  in_RDI->p = (Layer *)saltbase;
  in_RDI->p2 = (Layer *)CONCAT44(mc,CONCAT13(zoom,CONCAT12(edge,in_stack_00000010)));
  return in_RDI;
}

Assistant:

Layer *setupLayer(Layer *l, mapfunc_t *map, int mc,
    int8_t zoom, int8_t edge, uint64_t saltbase, Layer *p, Layer *p2)
{
    //Layer *l = g->layers + layerId;
    l->getMap = map;
    l->mc = mc;
    l->zoom = zoom;
    l->edge = edge;
    l->scale = 0;
    if (saltbase == 0 || saltbase == LAYER_INIT_SHA)
        l->layerSalt = saltbase;
    else
        l->layerSalt = getLayerSalt(saltbase);
    l->startSalt = 0;
    l->startSeed = 0;
    l->noise = NULL;
    l->data = NULL;
    l->p = p;
    l->p2 = p2;
    return l;
}